

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int getsym_op(void)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  int local_10;
  char local_check;
  char c;
  int i;
  int valid;
  
  bVar3 = true;
  local_10 = 0;
  uVar1 = *expr;
  while (bVar3) {
    uVar2 = *expr;
    ppuVar5 = __ctype_b_loc();
    if (((((((*ppuVar5)[(int)(char)uVar2] & 0x400) == 0) && (uVar2 != '_')) && (uVar2 != '.')) &&
        (uVar2 != '@')) &&
       ((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(char)uVar2] & 0x800) == 0 || (local_10 < 1))))
    {
      if (((uVar1 == '.') || (uVar1 == '@')) && ((uVar2 == '-' || (uVar2 == '+')))) {
        if (local_10 < 0x3f) {
          local_10 = local_10 + 1;
          symbol[local_10] = uVar2;
        }
        expr = expr + 1;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      if (local_10 < 0x3f) {
        local_10 = local_10 + 1;
        symbol[local_10] = uVar2;
      }
      expr = expr + 1;
    }
  }
  if ((local_10 == 1) &&
     ((iVar4 = toupper((int)symbol[1]), iVar4 == 0x41 || (iVar4 == 0x58 || iVar4 == 0x59)))) {
    error("Symbol is reserved (A, X or Y)!");
    local_10 = 0;
  }
  symbol[0] = (char)local_10;
  symbol[local_10 + 1] = '\0';
  return local_10;
}

Assistant:

int
getsym_op(void)
{
	int	valid;
	int	i;
	char c;
	char local_check;

	valid = 1;
	i = 0;

	/* get the symbol, stop to the first 'non symbol' char */
	local_check = *expr;
	while (valid) {
		c = *expr;
		if (isalpha(c) || c == '_' || c == '.' || c == '@' || (isdigit(c) && i >= 1)) {
			if (i < SBOLSZ - 1)
				symbol[++i] = c;
			expr++;
		}
		else if((local_check=='.' || local_check=='@') && ((c=='-') || (c=='+'))) {
                if (i < SBOLSZ - 1)
                    symbol[++i] = c;
                expr++;
             }
            else {
                valid = 0;
            }
	}

	/* is it a reserved symbol? */
	if (i == 1) {
		switch (toupper(symbol[1])) {
		case 'A':
		case 'X':
		case 'Y':
			error("Symbol is reserved (A, X or Y)!");
			i = 0;
		}
	}

	/* store symbol length */
	symbol[0] = i;
	symbol[i+1] = '\0';
	return (i);
}